

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O3

void __thiscall
QTextDocumentPrivate::setBlockFormat
          (QTextDocumentPrivate *this,QTextBlock *from,QTextBlock *to,QTextBlockFormat *newFormat,
          FormatChangeMode mode)

{
  QTextLayout *pQVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long *plVar7;
  long *plVar8;
  long lVar9;
  totally_ordered_wrapper<QFontPrivate_*> tVar10;
  uint uVar11;
  long in_FS_OFFSET;
  int local_b4;
  undefined1 local_88 [8];
  undefined8 local_80;
  undefined1 *puStack_78;
  Data *local_70;
  undefined1 local_68 [16];
  QTextBlock local_58;
  QTextBlock local_48;
  QSharedDataPointer<QTextFormatPrivate> local_38;
  
  local_38.d.ptr = *(totally_ordered_wrapper<QTextFormatPrivate_*> *)(in_FS_OFFSET + 0x28);
  iVar3 = this->editBlock;
  this->editBlock = iVar3 + 1;
  if (iVar3 == 0) {
    this->revision = this->revision + 1;
  }
  local_b4 = -1;
  if (mode == SetFormat) {
    local_b4 = QTextFormatCollection::indexForFormat(&this->formats,&newFormat->super_QTextFormat);
  }
  iVar3 = QTextFormat::objectIndex(&newFormat->super_QTextFormat);
  objectForIndex(this,iVar3);
  plVar7 = (long *)QMetaObject::cast((QObject *)&QTextBlockGroup::staticMetaObject);
  tVar10.ptr = (QFontPrivate *)from->p;
  uVar11 = from->n;
  local_48._12_4_ = 0xaaaaaaaa;
  local_48.n = uVar11;
  local_58.p = to->p;
  local_58.n = to->n;
  local_58._12_4_ = 0xaaaaaaaa;
  local_48.p = (QTextDocumentPrivate *)tVar10.ptr;
  bVar2 = QTextBlock::isValid(&local_58);
  if (bVar2) {
    QTextBlock::next((QTextBlock *)local_88);
    local_58.p = (QTextDocumentPrivate *)CONCAT44(local_88._4_4_,local_88._0_4_);
    local_58.n = (uint)local_80;
  }
  if (((QTextDocumentPrivate *)tVar10.ptr != local_58.p) || (uVar11 != local_58.n)) {
    do {
      iVar3 = (((QTextDocumentPrivate *)tVar10.ptr)->blocks).data.field_0.fragments[uVar11].format;
      local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QTextFormatCollection::format((QTextFormatCollection *)local_88,(int)&this->formats);
      QTextFormat::toBlockFormat((QTextFormat *)local_68);
      QTextFormat::~QTextFormat((QTextFormat *)local_88);
      iVar4 = QTextFormat::objectIndex((QTextFormat *)local_68);
      objectForIndex(this,iVar4);
      plVar8 = (long *)QMetaObject::cast((QObject *)&QTextBlockGroup::staticMetaObject);
      if (mode == MergeFormat) {
        QTextFormat::merge((QTextFormat *)local_68,&newFormat->super_QTextFormat);
        local_b4 = QTextFormatCollection::indexForFormat(&this->formats,(QTextFormat *)local_68);
        iVar4 = QTextFormat::objectIndex((QTextFormat *)local_68);
        objectForIndex(this,iVar4);
        plVar7 = (long *)QMetaObject::cast((QObject *)&QTextBlockGroup::staticMetaObject);
      }
      (((BlockMap *)((long)local_48.p + 0x160))->data).field_0.fragments
      [local_48._8_8_ & 0xffffffff].format = local_b4;
      pQVar1 = (((BlockMap *)((long)local_48.p + 0x160))->data).field_0.fragments
               [local_48._8_8_ & 0xffffffff].layout;
      if (pQVar1 != (QTextLayout *)0x0) {
        QTextEngine::invalidate(pQVar1->d);
      }
      local_70 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      puStack_78 = &DAT_aaaaaaaaaaaaaaaa;
      local_88._0_4_ = 0x1010003;
      local_80 = (QTextFormat *)0xaaaaaaaa00000000;
      local_88._4_4_ = iVar3;
      iVar3 = QTextBlock::position(&local_48);
      local_80 = (QTextFormat *)CONCAT44(iVar3,(uint)local_80);
      puStack_78 = (undefined1 *)CONCAT44(puStack_78._4_4_,1);
      local_70 = (Data *)((ulong)local_70 & 0xffffffff00000000);
      appendUndoItem(this,(QTextUndoCommand *)local_88);
      if (plVar7 == plVar8) {
        lVar9 = 0x70;
      }
      else {
        if (plVar8 != (long *)0x0) {
          (**(code **)(*plVar8 + 0x68))(plVar8,&local_48);
        }
        lVar9 = 0x60;
        plVar8 = plVar7;
      }
      if (plVar8 != (long *)0x0) {
        (**(code **)(*plVar7 + lVar9))(plVar7,&local_48);
      }
      QTextFormat::~QTextFormat((QTextFormat *)local_68);
      QTextBlock::next((QTextBlock *)local_88);
      tVar10.ptr._4_4_ = local_88._4_4_;
      tVar10.ptr._0_4_ = local_88._0_4_;
      local_48.n = (uint)local_80;
      uVar11 = (uint)local_80;
      local_48.p = (QTextDocumentPrivate *)tVar10.ptr;
    } while (((QTextDocumentPrivate *)tVar10.ptr != local_58.p) || ((uint)local_80 != local_58.n));
  }
  iVar3 = QTextBlock::position(from);
  iVar4 = QTextBlock::position(to);
  iVar5 = QTextBlock::length(to);
  iVar6 = QTextBlock::position(from);
  documentChange(this,iVar3,(iVar4 + iVar5) - iVar6);
  endEditBlock(this);
  if ((totally_ordered_wrapper<QTextFormatPrivate_*>)*(QTextFormatPrivate **)(in_FS_OFFSET + 0x28)
      == local_38.d.ptr) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextDocumentPrivate::setBlockFormat(const QTextBlock &from, const QTextBlock &to,
                                          const QTextBlockFormat &newFormat, FormatChangeMode mode)
{
    beginEditBlock();

    Q_ASSERT(mode != SetFormatAndPreserveObjectIndices); // only implemented for setCharFormat

    Q_ASSERT(newFormat.isValid());

    int newFormatIdx = -1;
    if (mode == SetFormat)
        newFormatIdx = formats.indexForFormat(newFormat);
    QTextBlockGroup *group = qobject_cast<QTextBlockGroup *>(objectForFormat(newFormat));

    QTextBlock it = from;
    QTextBlock end = to;
    if (end.isValid())
        end = end.next();

    for (; it != end; it = it.next()) {
        int oldFormat = block(it)->format;
        QTextBlockFormat format = formats.blockFormat(oldFormat);
        QTextBlockGroup *oldGroup = qobject_cast<QTextBlockGroup *>(objectForFormat(format));
        if (mode == MergeFormat) {
            format.merge(newFormat);
            newFormatIdx = formats.indexForFormat(format);
            group = qobject_cast<QTextBlockGroup *>(objectForFormat(format));
        }
        block(it)->format = newFormatIdx;

        block(it)->invalidate();

        QT_INIT_TEXTUNDOCOMMAND(c, QTextUndoCommand::BlockFormatChanged, true, QTextUndoCommand::MoveCursor, oldFormat,
                                0, it.position(), 1, 0);
        appendUndoItem(c);

        if (group != oldGroup) {
            if (oldGroup)
                oldGroup->blockRemoved(it);
            if (group)
                group->blockInserted(it);
        } else if (group) {
            group->blockFormatChanged(it);
        }
    }

    documentChange(from.position(), to.position() + to.length() - from.position());

    endEditBlock();
}